

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidgetEffectSourcePrivate * __thiscall
QWidgetEffectSourcePrivate::pixmap
          (QWidgetEffectSourcePrivate *this,CoordinateSystem system,QPoint *offset,
          PixmapPadMode mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *plVar3;
  QWidget *this_00;
  QPoint *pQVar4;
  long lVar5;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar6;
  int in_R8D;
  long in_FS_OFFSET;
  double dVar7;
  int iVar14;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  QPoint local_60;
  QRectF local_58;
  long local_38;
  
  lVar6 = CONCAT44(in_register_00000034,system);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(lVar6 + 0x98) == 0 && (int)offset == 0) {
    pixmap();
  }
  else {
    local_60.xp.m_i = 0;
    local_60.yp.m_i = 0;
    lVar5 = *(long *)(*(long *)(lVar6 + 0x90) + 0x20);
    local_88 = (undefined1  [16])0x0;
    uVar1 = *(undefined8 *)(lVar5 + 0x1c);
    uVar2 = *(undefined8 *)(lVar5 + 0x14);
    iVar14 = (int)uVar1 - (int)uVar2;
    auVar9._4_4_ = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
    auVar9._8_4_ = auVar9._4_4_;
    auVar9._12_4_ = -(uint)(auVar9._4_4_ < 0);
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    local_78 = (double)(CONCAT44(-(uint)(iVar14 < 0),iVar14) + 1);
    dStack_70 = (double)(auVar9._8_8_ - auVar13._8_8_);
    if ((int)offset == 0) {
      pQVar4 = (QPoint *)QPainter::worldTransform();
      QTransform::mapRect(&local_58);
      local_78 = local_58.w;
      dStack_70 = local_58.h;
      local_88._8_8_ = local_58.yp;
      local_88._0_8_ = local_58.xp;
      local_60 = (QPoint)QTransform::map(pQVar4);
    }
    if (in_R8D == 1) {
      local_58.xp = (double)local_88._0_8_ + -1.0;
      local_58.yp = (double)local_88._8_8_ + -1.0;
      local_58.w = local_78 + 1.0 + 1.0;
      local_58.h = dStack_70 + 1.0 + 1.0;
    }
    else if (in_R8D == 2) {
      plVar3 = *(long **)(*(long *)(*(long *)(lVar6 + 0x90) + 8) + 200);
      (**(code **)(*plVar3 + 0x60))(&local_58,plVar3,local_88);
    }
    auVar13 = QRectF::toAlignedRect();
    if ((undefined8 *)CONCAT44(in_register_0000000c,mode) != (undefined8 *)0x0) {
      *(undefined8 *)CONCAT44(in_register_0000000c,mode) = auVar13._0_8_;
    }
    local_60.yp.m_i = local_60.yp.m_i - auVar13._4_4_;
    local_60.xp.m_i = local_60.xp.m_i - auVar13._0_4_;
    lVar5 = QPainter::device();
    if (lVar5 == 0) {
      pixmap();
      dVar7 = 1.0;
    }
    else {
      dVar7 = (double)QPaintDevice::devicePixelRatio();
    }
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->super_QGraphicsEffectSourcePrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(this->super_QGraphicsEffectSourcePrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    dVar8 = (double)((auVar13._8_4_ - auVar13._0_4_) + 1) * dVar7;
    dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    dVar10 = dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar11 = (double)((auVar13._12_4_ - auVar13._4_4_) + 1) * dVar7;
    dVar11 = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
    dVar12 = dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    local_58.xp = (qreal)CONCAT44((int)(double)(-(ulong)(2147483647.0 < dVar11) & 0x41dfffffffc00000
                                               | ~-(ulong)(2147483647.0 < dVar11) & (ulong)dVar12),
                                  (int)(double)(-(ulong)(2147483647.0 < dVar8) & 0x41dfffffffc00000
                                               | ~-(ulong)(2147483647.0 < dVar8) & (ulong)dVar10));
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&local_58);
    QPixmap::setDevicePixelRatio(dVar7);
    QColor::QColor((QColor *)&local_58,transparent);
    QPixmap::fill((QColor *)this);
    this_00 = *(QWidget **)(lVar6 + 0x90);
    QRegion::QRegion((QRegion *)&local_58);
    QWidget::render(this_00,(QPaintDevice *)this,&local_60,(QRegion *)&local_58,(RenderFlags)0x2);
    QRegion::~QRegion((QRegion *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QWidgetEffectSourcePrivate::pixmap(Qt::CoordinateSystem system, QPoint *offset,
                                           QGraphicsEffect::PixmapPadMode mode) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (Q_UNLIKELY(!context && deviceCoordinates)) {
        // Device coordinates without context not yet supported.
        qWarning("QGraphicsEffectSource::pixmap: Not yet implemented, lacking device context");
        return QPixmap();
    }

    QPoint pixmapOffset;
    QRectF sourceRect = m_widget->rect();

    if (deviceCoordinates) {
        const QTransform &painterTransform = context->painter->worldTransform();
        sourceRect = painterTransform.mapRect(sourceRect);
        pixmapOffset = painterTransform.map(pixmapOffset);
    }

    QRect effectRect;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect)
        effectRect = m_widget->graphicsEffect()->boundingRectFor(sourceRect).toAlignedRect();
    else if (mode == QGraphicsEffect::PadToTransparentBorder)
        effectRect = sourceRect.adjusted(-1, -1, 1, 1).toAlignedRect();
    else
        effectRect = sourceRect.toAlignedRect();

    if (offset)
        *offset = effectRect.topLeft();

    pixmapOffset -= effectRect.topLeft();

    qreal dpr(1.0);
    if (const auto *paintDevice = context->painter->device())
        dpr = paintDevice->devicePixelRatio();
    else
        qWarning("QWidgetEffectSourcePrivate::pixmap: Painter not active");
    QPixmap pixmap(effectRect.size() * dpr);
    pixmap.setDevicePixelRatio(dpr);

    pixmap.fill(Qt::transparent);
    m_widget->render(&pixmap, pixmapOffset, QRegion(), QWidget::DrawChildren);
    return pixmap;
}